

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSIUnit,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSIUnit *this;
  
  this = (IfcSIUnit *)operator_new(0xa8);
  Assimp::IFC::Schema_2x3::IfcSIUnit::IfcSIUnit(this);
  GenericFill<Assimp::IFC::Schema_2x3::IfcSIUnit>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcNamedUnit).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper +
         (long)(this->super_IfcNamedUnit).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper[-3]
         );
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }